

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

bool __thiscall
Am_Object_Data::propagate_change
          (Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *cause,Am_Value *old_value,
          Am_Value *new_value)

{
  bool bVar1;
  bool local_41;
  Am_Object_Data *local_40;
  Am_Object_Data *current;
  bool no_inherit;
  Am_Value *new_value_local;
  Am_Value *old_value_local;
  Am_Constraint *cause_local;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  current._7_1_ = true;
  for (local_40 = this->first_instance; local_40 != (Am_Object_Data *)0x0;
      local_40 = local_40->next_instance) {
    bVar1 = notify_change(local_40,key,cause,old_value,new_value);
    local_41 = false;
    if (bVar1) {
      local_41 = current._7_1_;
    }
    current._7_1_ = local_41;
  }
  return current._7_1_;
}

Assistant:

bool
Am_Object_Data::propagate_change(Am_Slot_Key key, Am_Constraint *cause,
                                 const Am_Value &old_value,
                                 const Am_Value &new_value)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  bool no_inherit = true;
  Am_Object_Data *current = first_instance;
  while (current) {
    no_inherit =
        current->notify_change(key, cause, old_value, new_value) && no_inherit;
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  return no_inherit;
}